

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

void __thiscall
bssl::Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::clear
          (Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *this)

{
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *this_00;
  size_t sVar1;
  
  this_00 = this->data_;
  sVar1 = this->size_;
  if (sVar1 != 0) {
    do {
      std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::~unique_ptr(this_00);
      this_00 = this_00 + 1;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
    this_00 = this->data_;
  }
  OPENSSL_free(this_00);
  this->data_ = (unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  return;
}

Assistant:

void clear() {
    std::destroy_n(data_, size_);
    OPENSSL_free(data_);
    data_ = nullptr;
    size_ = 0;
    capacity_ = 0;
  }